

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_tracker_connection.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::udp_tracker_connection::udp_tracker_connection
          (udp_tracker_connection *this,io_context *ios,tracker_manager *man,tracker_request *req,
          weak_ptr<libtorrent::aux::request_callback> *c)

{
  tracker_manager *ios_00;
  weak_ptr<libtorrent::aux::request_callback> local_148;
  tracker_request local_138;
  weak_ptr<libtorrent::aux::request_callback> *local_30;
  weak_ptr<libtorrent::aux::request_callback> *c_local;
  tracker_request *req_local;
  tracker_manager *man_local;
  io_context *ios_local;
  udp_tracker_connection *this_local;
  
  local_30 = c;
  c_local = (weak_ptr<libtorrent::aux::request_callback> *)req;
  req_local = (tracker_request *)man;
  man_local = (tracker_manager *)ios;
  ios_local = (io_context *)this;
  tracker_request::tracker_request(&local_138,req);
  ios_00 = man_local;
  ::std::weak_ptr<libtorrent::aux::request_callback>::weak_ptr(&local_148,c);
  tracker_connection::tracker_connection
            (&this->super_tracker_connection,man,&local_138,(io_context *)ios_00,&local_148);
  ::std::weak_ptr<libtorrent::aux::request_callback>::~weak_ptr(&local_148);
  tracker_request::~tracker_request(&local_138);
  (this->super_tracker_connection).super_timeout_handler._vptr_timeout_handler =
       (_func_int **)&PTR_on_timeout_00b94258;
  ::std::__cxx11::string::string((string *)&this->m_hostname);
  ::std::
  vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
  ::vector(&this->m_endpoints);
  boost::asio::ip::basic_endpoint<boost::asio::ip::udp>::basic_endpoint(&this->m_target);
  this->m_transaction_id = 0;
  this->m_attempts = 0;
  this->m_state = error;
  this->m_abort = false;
  update_transaction_id(this);
  return;
}

Assistant:

udp_tracker_connection::udp_tracker_connection(
		io_context& ios
		, tracker_manager& man
		, tracker_request const& req
		, std::weak_ptr<request_callback> c)
		: tracker_connection(man, req, ios, std::move(c))
		, m_transaction_id(0)
		, m_attempts(0)
		, m_state(action_t::error)
		, m_abort(false)
	{
		update_transaction_id();
	}